

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_stats.cpp
# Opt level: O3

void duckdb::ArrayStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  BaseStatistics *this;
  Vector *vector_00;
  idx_t iVar3;
  long lVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  ulong uVar8;
  SelectionVector element_sel;
  UnifiedVectorFormat vdata;
  SelectionVector local_90;
  UnifiedVectorFormat local_78;
  
  this = GetChildStats(stats);
  vector_00 = ArrayVector::GetEntry(vector);
  iVar3 = ArrayType::GetSize(&vector->type);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(vector,count,&local_78);
  if (count == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel->sel_vector[iVar5];
      }
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(local_78.sel)->sel_vector[iVar6];
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar8 = 1;
      }
      else {
        uVar8 = (ulong)((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0);
      }
      lVar4 = lVar4 + uVar8;
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  SelectionVector::SelectionVector(&local_90,lVar4 * iVar3);
  if (count == 0) {
    iVar5 = 0;
  }
  else {
    psVar1 = sel->sel_vector;
    psVar2 = (local_78.sel)->sel_vector;
    iVar6 = 0;
    iVar5 = 0;
    do {
      iVar7 = iVar6;
      if (psVar1 != (sel_t *)0x0) {
        iVar7 = (idx_t)psVar1[iVar6];
      }
      if (psVar2 != (sel_t *)0x0) {
        iVar7 = (idx_t)psVar2[iVar7];
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (iVar3 != 0) goto LAB_0176bbe7;
      }
      else if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0 && iVar3 != 0) {
LAB_0176bbe7:
        uVar8 = iVar7 * iVar3;
        lVar4 = iVar3 + (iVar3 == 0);
        do {
          local_90.sel_vector[iVar5] = (sel_t)uVar8;
          iVar5 = iVar5 + 1;
          uVar8 = (ulong)((sel_t)uVar8 + 1);
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != count);
  }
  BaseStatistics::Verify(this,vector_00,&local_90,iVar5);
  if (local_90.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ArrayStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &child_stats = ArrayStats::GetChildStats(stats);
	auto &child_entry = ArrayVector::GetEntry(vector);
	auto array_size = ArrayType::GetSize(vector.GetType());

	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	// Basically,
	// 1. Count the number of valid arrays
	// 2. Create a selection vector with the size of the number of valid arrays * array_size
	// 3. Fill the selection vector with the offsets of all the elements in the child vector
	//      that exist in each valid array
	// 4. Use that selection vector to verify the child stats

	idx_t valid_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (vdata.validity.RowIsValid(index)) {
			valid_count++;
		}
	}

	SelectionVector element_sel(valid_count * array_size);
	idx_t element_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		auto offset = index * array_size;
		if (vdata.validity.RowIsValid(index)) {
			for (idx_t elem_idx = 0; elem_idx < array_size; elem_idx++) {
				element_sel.set_index(element_count++, offset + elem_idx);
			}
		}
	}

	child_stats.Verify(child_entry, element_sel, element_count);
}